

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Runtime::~Runtime(Runtime *this)

{
  bool bVar1;
  element_type *this_00;
  reference ppVar2;
  pair<const_Jinx::Variant,_Jinx::Variant> *e;
  iterator __end4;
  iterator __begin4;
  element_type *__range4;
  CollectionPtr c;
  pair<const_unsigned_long,_Jinx::Variant> *s;
  iterator __end2;
  iterator __begin2;
  PropertyMap *__range2;
  Runtime *this_local;
  
  __end2 = std::
           map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
           ::begin(&this->m_propertyMap);
  s = (pair<const_unsigned_long,_Jinx::Variant> *)
      std::
      map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
      ::end(&this->m_propertyMap);
  while (bVar1 = std::operator!=(&__end2,(_Self *)&s), bVar1) {
    c.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Jinx::Variant>_>::operator*(&__end2);
    bVar1 = Variant::IsCollection
                      (&((reference)
                        c.
                        super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->second);
    if (bVar1) {
      Variant::GetCollection((Variant *)&__range4);
      this_00 = std::
                __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&__range4);
      __end4 = std::
               map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
               ::begin(this_00);
      e = (pair<const_Jinx::Variant,_Jinx::Variant> *)
          std::
          map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
          ::end(this_00);
      while (bVar1 = std::operator!=(&__end4,(_Self *)&e), bVar1) {
        ppVar2 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator*
                           (&__end4);
        Variant::SetNull(&ppVar2->second);
        std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++(&__end4);
      }
      std::
      shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
      ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                     *)&__range4);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Jinx::Variant>_>::operator++(&__end2);
  }
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
  ::~map(&this->m_symbolTypeMap);
  std::
  map<unsigned_long,_Jinx::Variant,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_Jinx::Variant>,_4096UL,_16UL>_>
  ::~map(&this->m_propertyMap);
  std::
  map<unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::shared_ptr<Jinx::Impl::FunctionDefinition>_>,_4096UL,_16UL>_>
  ::~map(&this->m_functionMap);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::shared_ptr<Jinx::Impl::Library>_>,_4096UL,_16UL>_>
  ::~map(&this->m_libraryMap);
  StaticArena<4096UL,_16UL>::~StaticArena(&this->m_staticArena);
  std::enable_shared_from_this<Jinx::Impl::Runtime>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<Jinx::Impl::Runtime>);
  IRuntime::~IRuntime(&this->super_IRuntime);
  return;
}

Assistant:

inline_t Runtime::~Runtime()
	{
		// Clear potential circular references by explicitly destroying collection values
		for (auto & s : m_propertyMap)
		{
			if (s.second.IsCollection())
			{
				auto c = s.second.GetCollection();
				for (auto & e : *c)
				{
					e.second.SetNull();
				}
			}
		}
	}